

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AutoGeometry.cpp
# Opt level: O2

char * __thiscall HACD::MyAutoGeometry::stristr(MyAutoGeometry *this,char *str,char *key)

{
  size_t sVar1;
  char *pcVar2;
  char ikey [2048];
  char istr [2048];
  char acStack_1028 [2048];
  char local_828 [2048];
  
  sVar1 = strlen(str);
  if (0x7ff < sVar1) {
    __assert_fail("strlen(str) < 2048",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/AutoGeometry.cpp"
                  ,0x1a6,
                  "virtual const char *HACD::MyAutoGeometry::stristr(const char *, const char *)");
  }
  sVar1 = strlen(key);
  if (sVar1 < 0x800) {
    strncpy(local_828,str,0x800);
    strncpy(acStack_1028,key,0x800);
    mystrlwr(this,local_828);
    mystrlwr(this,acStack_1028);
    pcVar2 = strstr(local_828,acStack_1028);
    if (pcVar2 != (char *)0x0) {
      pcVar2 = str + (uint)((int)pcVar2 - (int)local_828);
    }
    return pcVar2;
  }
  __assert_fail("strlen(key) < 2048",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/AutoGeometry.cpp"
                ,0x1a7,
                "virtual const char *HACD::MyAutoGeometry::stristr(const char *, const char *)");
}

Assistant:

virtual const char * stristr(const char *str,const char *key)  // case insensitive ststr
		{
			HACD_ASSERT( strlen(str) < 2048 );
			HACD_ASSERT( strlen(key) < 2048 );

			char istr[2048];
			char ikey[2048];

			strncpy(istr,str,2048);
			strncpy(ikey,key,2048);
			mystrlwr(istr);
			mystrlwr(ikey);

			char *foo = strstr(istr,ikey);
			if ( foo )
			{
				hacd::HaU32 loc = (hacd::HaU32)(foo - istr);
				foo = (char *)str+loc;
			}

			return foo;
		}